

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O0

void __thiscall
JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::flush
          (JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *this)

{
  bool bVar1;
  HalfCycles local_28;
  HalfCycles local_20;
  WrappedInt<HalfCycles> local_18;
  HalfCycles duration;
  JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *this_local;
  
  if ((this->is_flushed_ & 1U) == 0) {
    this->is_flushed_ = true;
    this->did_flush_ = true;
    duration.super_WrappedInt<HalfCycles>.length_ =
         (WrappedInt<HalfCycles>)(WrappedInt<HalfCycles>)this;
    HalfCycles::HalfCycles(&local_20,0x28cc55);
    local_18.length_ =
         (IntType)WrappedInt<HalfCycles>::divide<HalfCycles>
                            (&(this->time_since_update_).super_WrappedInt<HalfCycles>,&local_20);
    HalfCycles::HalfCycles(&local_28,0);
    bVar1 = WrappedInt<HalfCycles>::operator>(&local_18,&local_28);
    if (bVar1) {
      Motorola::MFP68901::MFP68901::run_for(&this->object_,(HalfCycles)local_18.length_);
    }
  }
  return;
}

Assistant:

forceinline void flush() {
			if(!is_flushed_) {
				did_flush_ = is_flushed_ = true;
				if constexpr (divider == 1) {
					const auto duration = time_since_update_.template flush<TargetTimeScale>();
					object_.run_for(duration);
				} else {
					const auto duration = time_since_update_.template divide<TargetTimeScale>(LocalTimeScale(divider));
					if(duration > TargetTimeScale(0))
						object_.run_for(duration);
				}
			}
		}